

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg.cpp
# Opt level: O1

bool mg::data::mrg_write(Mrg *in,string *hed,string *mrg)

{
  uint uVar1;
  pointer pcVar2;
  long lVar3;
  short sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  std::__cxx11::string::resize
            ((ulong)hed,(char)(*(long *)&in->field_0x8 - *(long *)in >> 4) * 'X' + '\x10');
  pcVar2 = (hed->_M_dataplus)._M_p;
  mrg->_M_string_length = 0;
  *(mrg->_M_dataplus)._M_p = '\0';
  lVar3 = *(long *)in;
  if (*(long *)&in->field_0x8 == lVar3) {
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    uVar7 = 0;
    uVar8 = 1;
    do {
      *(int *)(pcVar2 + uVar7 * 8) = (int)lVar6;
      lVar9 = uVar7 * 0x30;
      uVar1 = *(uint *)(lVar3 + 8 + lVar9);
      sVar4 = ((short)(uVar1 >> 0xb) + 1) - (ushort)((uVar1 & 0x7ff) == 0);
      *(short *)(pcVar2 + uVar7 * 8 + 4) = sVar4;
      if (*(char *)(lVar3 + 0x20 + lVar9) == '\x01') {
        uVar1 = *(uint *)(lVar3 + lVar9 + 0x28);
        sVar4 = ((short)(uVar1 >> 0xb) + 1) - (ushort)((uVar1 & 0x7ff) == 0);
      }
      *(short *)(pcVar2 + uVar7 * 8 + 6) = sVar4;
      std::__cxx11::string::resize((ulong)mrg,(char)mrg->_M_string_length);
      memcpy((mrg->_M_dataplus)._M_p + lVar6 * 0x800,*(void **)(*(long *)in + lVar9),
             *(size_t *)(*(long *)in + 8 + lVar9));
      lVar6 = lVar6 + (ulong)*(ushort *)(pcVar2 + uVar7 * 8 + 4);
      lVar3 = *(long *)in;
      uVar5 = (*(long *)&in->field_0x8 - lVar3 >> 4) * -0x5555555555555555;
      bVar10 = uVar8 <= uVar5;
      lVar9 = uVar5 - uVar8;
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar10 && lVar9 != 0);
  }
  pcVar2 = pcVar2 + uVar5 * 8;
  pcVar2[0] = -1;
  pcVar2[1] = -1;
  pcVar2[2] = -1;
  pcVar2[3] = -1;
  pcVar2[4] = -1;
  pcVar2[5] = -1;
  pcVar2[6] = -1;
  pcVar2[7] = -1;
  pcVar2[8] = -1;
  pcVar2[9] = -1;
  pcVar2[10] = -1;
  pcVar2[0xb] = -1;
  pcVar2[0xc] = -1;
  pcVar2[0xd] = -1;
  pcVar2[0xe] = -1;
  pcVar2[0xf] = -1;
  return true;
}

Assistant:

bool mrg_write(const Mrg &in, std::string &hed, std::string &mrg) {
  // Work out the total header size
  // Note that there are 2 extra header entries of 0xFF for EOF
  const ssize_t header_size =
      (in.entries.size() + 2) * sizeof(Mrg::PackedEntryHeader);
  hed.resize(header_size);

  // Serialize each entry
  Mrg::PackedEntryHeader *headers =
      reinterpret_cast<Mrg::PackedEntryHeader *>(hed.data());
  ssize_t mrg_write_offset_sectors = 0;
  mrg.clear();
  for (unsigned i = 0; i < in.entries.size(); i++) {
    // Pack header
    headers[i].offset = mrg_write_offset_sectors;
    headers[i].size_sectors = Mrg::size_in_sectors(in.entries[i].data.size());

    // If the entry is compressed, use the correct uncompressed size
    // Else, use the normal size
    if (in.entries[i].is_compressed) {
      headers[i].size_uncompressed_sectors =
          Mrg::size_in_sectors(in.entries[i].uncompressed_size_bytes);
    } else {
      headers[i].size_uncompressed_sectors =
          Mrg::size_in_sectors(in.entries[i].data.size());
    }

    // Copy data
    mrg.resize(mrg.size() + headers[i].size_sectors * Mrg::SECTOR_SIZE, '\0');
    memcpy(&mrg[mrg_write_offset_sectors * Mrg::SECTOR_SIZE],
           in.entries[i].data.data(), in.entries[i].data.size());

    // Increment write offset
    mrg_write_offset_sectors += headers[i].size_sectors;

    // Header to file order
    headers[i].to_file_order();
  }

  // Write EOF on the HED file
  memset(&headers[in.entries.size()], 0xFF, sizeof(Mrg::PackedEntryHeader) * 2);

  return true;
}